

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderTextEllipsis
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,float clip_max_x,
               float ellipsis_max_x,char *text,char *text_end_full,ImVec2 *text_size_if_known)

{
  ImFont *this;
  char *text_end;
  ImDrawList *draw_list_00;
  uint uVar1;
  ImU32 col;
  ImGuiContext *pIVar2;
  ImVec2 IVar3;
  float max_width;
  float fVar4;
  char *text_end_ellipsis;
  ImDrawList *local_88;
  float local_7c;
  ImVec2 local_78;
  ImVec2 local_60;
  undefined1 local_58 [16];
  ImGuiContext *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar2 = GImGui;
  local_88 = draw_list;
  local_7c = ellipsis_max_x;
  if (text_end_full == (char *)0x0) {
    text_end_full = FindRenderedTextEnd(text,(char *)0x0);
  }
  if (text_size_if_known == (ImVec2 *)0x0) {
    local_60 = CalcTextSize(text,text_end_full,false,0.0);
  }
  else {
    local_60 = *text_size_if_known;
  }
  if (local_60.x <= pos_max->x - pos_min->x) {
    text_end_ellipsis = (char *)CONCAT44(pos_max->y,clip_max_x);
    local_40.x = 0.0;
    local_40.y = 0.0;
    RenderTextClippedEx(local_88,pos_min,(ImVec2 *)&text_end_ellipsis,text,text_end_full,&local_60,
                        &local_40,(ImRect *)0x0);
  }
  else {
    local_48 = pIVar2;
    this = local_88->_Data->Font;
    fVar4 = local_88->_Data->FontSize;
    local_58._0_4_ = fVar4;
    text_end_ellipsis = (char *)0x0;
    max_width = (pos_max->x + -5.0) - pos_min->x;
    if (max_width <= 1.0) {
      max_width = 1.0;
    }
    local_78 = ImFont::CalcTextSizeA(this,fVar4,max_width,0.0,text,text_end_full,&text_end_ellipsis)
    ;
    pIVar2 = local_48;
    if (text_end_ellipsis < text_end_full && text_end_ellipsis == text) {
      uVar1 = ImTextCountUtf8BytesFromChar(text,text_end_full);
      text_end_ellipsis = text + uVar1;
      local_78 = ImFont::CalcTextSizeA
                           (this,(float)local_58._0_4_,3.4028235e+38,0.0,text,text_end_ellipsis,
                            (char **)0x0);
      pIVar2 = local_48;
    }
    while ((draw_list_00 = local_88, text_end = text_end_ellipsis, text < text_end_ellipsis &&
           ((text_end_ellipsis[-1] == ' ' || (text_end_ellipsis[-1] == '\t'))))) {
      text_end_ellipsis = text_end_ellipsis + -1;
      IVar3 = ImFont::CalcTextSizeA
                        (this,(float)local_58._0_4_,3.4028235e+38,0.0,text_end_ellipsis,text_end,
                         (char **)0x0);
      local_78.x = local_78.x - IVar3.x;
    }
    local_40.y = pos_max->y;
    local_40.x = clip_max_x;
    local_38.x = 0.0;
    local_38.y = 0.0;
    RenderTextClippedEx(local_88,pos_min,&local_40,text,text_end_ellipsis,&local_60,&local_38,
                        (ImRect *)0x0);
    fVar4 = local_78.x + pos_min->x + 1.0;
    if (fVar4 + 5.0 + -1.0 <= local_7c) {
      local_58 = ZEXT416((uint)pos_min->y);
      local_78.x = fVar4;
      col = GetColorU32(0,1.0);
      IVar3.y = (float)local_58._0_4_;
      IVar3.x = local_78.x;
      RenderPixelEllipsis(draw_list_00,IVar3,col,3);
    }
  }
  if (pIVar2->LogEnabled == true) {
    LogRenderedText(pos_min,text,text_end_full);
  }
  return;
}

Assistant:

void    ImGui::RenderTextEllipsis(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, float clip_max_x, float ellipsis_max_x, const char* text, const char* text_end_full, const ImVec2* text_size_if_known)
{
    ImGuiContext& g = *GImGui;
    if (text_end_full == NULL)
        text_end_full = FindRenderedTextEnd(text);
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_end_full, false, 0.0f);

    if (text_size.x > pos_max.x - pos_min.x)
    {
        // Hello wo...
        // |       |   |
        // min   max   ellipsis_max
        //          <-> this is generally some padding value

        // FIXME-STYLE: RenderPixelEllipsis() style should use actual font data.
        const ImFont* font = draw_list->_Data->Font;
        const float font_size = draw_list->_Data->FontSize;
        const int ellipsis_dot_count = 3;
        const float ellipsis_width = (1.0f + 1.0f) * ellipsis_dot_count - 1.0f;
        const char* text_end_ellipsis = NULL;

        float text_width = ImMax((pos_max.x - ellipsis_width) - pos_min.x, 1.0f);
        float text_size_clipped_x = font->CalcTextSizeA(font_size, text_width, 0.0f, text, text_end_full, &text_end_ellipsis).x;
        if (text == text_end_ellipsis && text_end_ellipsis < text_end_full)
        {
            // Always display at least 1 character if there's no room for character + ellipsis
            text_end_ellipsis = text + ImTextCountUtf8BytesFromChar(text, text_end_full);
            text_size_clipped_x = font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text, text_end_ellipsis).x;
        }
        while (text_end_ellipsis > text && ImCharIsBlankA(text_end_ellipsis[-1]))
        {
            // Trim trailing space before ellipsis
            text_end_ellipsis--;
            text_size_clipped_x -= font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text_end_ellipsis, text_end_ellipsis + 1).x; // Ascii blanks are always 1 byte
        }
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_ellipsis, &text_size, ImVec2(0.0f, 0.0f));

        const float ellipsis_x = pos_min.x + text_size_clipped_x + 1.0f;
        if (ellipsis_x + ellipsis_width - 1.0f <= ellipsis_max_x)
            RenderPixelEllipsis(draw_list, ImVec2(ellipsis_x, pos_min.y), GetColorU32(ImGuiCol_Text), ellipsis_dot_count);
    }
    else
    {
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_full, &text_size, ImVec2(0.0f, 0.0f));
    }

    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_end_full);
}